

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O3

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<soul::IdentifierPath,std::__cxx11::string>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          CodeLocation *location,Type type,char *text,IdentifierPath *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Identifier *pIVar1;
  SourceCodeText *pSVar2;
  CompileMessage *pCVar3;
  undefined4 in_register_00000014;
  IdentifierPath *name;
  long *plVar4;
  undefined4 in_register_00000084;
  long lVar5;
  size_t index;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  string result;
  allocator_type local_101;
  Category local_100;
  Type local_fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  CompileMessage *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(char *)CONCAT44(in_register_00000084,type),
             (allocator<char> *)&local_70);
  convertToString_abi_cxx11_(&local_70,(soul *)text,name);
  plVar4 = local_40;
  pIVar1 = (args->pathSections).items;
  local_50[0] = plVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pIVar1,(long)&pIVar1->name + (args->pathSections).numActive);
  __l._M_len = 2;
  __l._M_array = &local_70;
  local_b8 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,__l,&local_101);
  lVar5 = -0x40;
  local_c0 = (long *)CONCAT44(in_register_00000014,category);
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_100 = (Category)this;
  local_fc = (Type)location;
  if (local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    index = 0;
    do {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_e0,local_d8 + (long)local_e0);
      replaceArgument(&local_70,&local_90,index,
                      (string *)
                      ((long)&((local_f8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar5));
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      lVar5 = lVar5 + 0x20;
    } while (index < (ulong)((long)local_f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_e0,local_d8 + (long)local_e0);
  pCVar3 = local_b8;
  choc::text::trim(&local_b8->description,&local_b0);
  pSVar2 = (SourceCodeText *)*local_c0;
  (pCVar3->location).sourceCode.object = pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  (pCVar3->location).location.data = (char *)local_c0[1];
  pCVar3->type = local_fc;
  pCVar3->category = local_100;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  return pCVar3;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }